

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  Statement *pSVar6;
  ShaderExecutor *pSVar7;
  Variable<tcu::Vector<float,_4>_> *pVVar8;
  pointer pcVar9;
  pointer pVVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  undefined8 uVar15;
  long lVar16;
  long lVar17;
  IVal *pIVar18;
  undefined8 *puVar19;
  long lVar20;
  Vector<float,_4> *val;
  size_t sVar21;
  string *psVar22;
  _Base_ptr p_Var23;
  FloatFormat *pFVar24;
  TestStatus *pTVar25;
  byte bVar26;
  IVal in2;
  IVal in3;
  IVal in1;
  FuncSet funcs;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_> outputs;
  Environment env;
  IVal in0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  float in_stack_fffffffffffffa38;
  _Alloc_hider _Var27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  TestLog *local_5a0;
  string local_598;
  size_t local_578;
  ulong local_570;
  FloatFormat *local_568;
  undefined1 local_560 [16];
  undefined1 local_550 [88];
  undefined1 local_4f8 [12];
  YesNoMaybe YStack_4ec;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  _Rb_tree_node_base *local_4d8;
  double local_4d0;
  FloatFormat local_498;
  long local_470;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_> local_468;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_438;
  undefined1 local_408 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  double local_3e8;
  Precision local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3d8;
  undefined4 local_3d0;
  ios_base local_398 [8];
  ios_base local_390 [264];
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar26 = 0;
  this_00 = this->m_samplings;
  pFVar24 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar21 = (this->m_caseCtx).numRandoms;
  local_550._80_8_ = __return_storage_ptr__;
  iVar13 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_568 = pFVar24;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar24,(FloatFormat *)(ulong)PVar5,(Precision)sVar21,(ulong)(iVar13 + 0xdeadbeef),
             (deUint32)in_stack_fffffffffffffa38);
  pVVar10 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  sVar21 = (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_278.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>_>_>::Outputs
            (&local_468,sVar21);
  local_498.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_498.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_498.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_498.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_498.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_498.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_498.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_498.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_498._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_438._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_438._M_impl.super__Rb_tree_header._M_header;
  local_438._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_438._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_438._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._M_impl.super__Rb_tree_header._M_header._M_right =
       local_438._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_5a0 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_468.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_280 = local_468.out1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_5a0;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(false);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_4f8 + 8);
  local_4f8._8_4_ = _S_red;
  local_4e8._M_allocated_capacity = 0;
  local_4d0 = 0.0;
  pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_578 = sVar21;
  local_4e8._8_8_ = p_Var4;
  local_4d8 = p_Var4;
  (*pSVar6->_vptr_Statement[4])(pSVar6,local_4f8);
  if ((_Rb_tree_node_base *)local_4e8._8_8_ != p_Var4) {
    uVar15 = local_4e8._8_8_;
    do {
      (**(code **)(**(long **)(uVar15 + 0x20) + 0x30))(*(long **)(uVar15 + 0x20),&local_1a8);
      uVar15 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar15);
    } while ((_Rb_tree_node_base *)uVar15 != p_Var4);
  }
  sVar21 = local_578;
  if (local_4d0 != 0.0) {
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_5a0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
      operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_4f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar7 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,sVar21 & 0xffffffff,&local_218,&local_288,0);
  lVar16 = 8;
  do {
    local_408[lVar16 + -8] = 0;
    *(undefined8 *)(local_408 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_408 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  lVar16 = 8;
  do {
    local_408[lVar16 + -8] = 0;
    *(undefined8 *)(local_408 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_408 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  lVar16 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  lVar16 = 8;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar16 + -8) = 0;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar16) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  lVar16 = 8;
  do {
    local_550[lVar16 + 0x50] = 0;
    *(undefined8 *)(local_4f8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_4f8 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  lVar16 = 8;
  do {
    local_550[lVar16 + 0x50] = 0;
    *(undefined8 *)(local_4f8 + lVar16) = 0x7ff0000000000000;
    *(undefined8 *)(local_4f8 + lVar16 + 8) = 0xfff0000000000000;
    lVar16 = lVar16 + 0x18;
  } while (lVar16 != 0x68);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_438,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_438,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_560);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_438,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffffa38);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_438,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_598);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_438,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_438,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_4f8);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar10) {
LAB_008b3d6b:
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_5a0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    pTVar25 = (TestStatus *)local_550._80_8_;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_408 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
    *&pTVar25->m_code = QP_TEST_RESULT_PASS;
    (((string *)((long)pTVar25 + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)pTVar25 + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)pTVar25 + 8),local_408._0_8_,
               (char *)(local_408._0_8_ + CONCAT44(local_408._12_4_,local_408._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) goto LAB_008b3f51;
    uVar15 = (_Base_ptr)
             CONCAT44(local_3f8._M_allocated_capacity._4_4_,local_3f8._M_allocated_capacity._0_4_);
    local_4f8._0_8_ = local_408._0_8_;
  }
  else {
    local_470 = sVar21 + (sVar21 == 0);
    lVar16 = 0;
    local_570 = 0;
    pFVar24 = local_568;
    do {
      lVar17 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar17 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x68);
      lVar17 = 8;
      do {
        *(undefined1 *)((long)local_1a8.m_data + lVar17 + -8) = 0;
        *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)((long)&local_1a8.m_data[0].m_lo + lVar17) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x68);
      lVar17 = 8;
      do {
        local_550[lVar17 + 0x50] = 0;
        *(undefined8 *)(local_4f8 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(local_4f8 + lVar17 + 8) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x68);
      lVar17 = 8;
      do {
        local_550[lVar17 + 0x50] = 0;
        *(undefined8 *)(local_4f8 + lVar17) = 0x7ff0000000000000;
        *(undefined8 *)(local_4f8 + lVar17 + 8) = 0xfff0000000000000;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x68);
      _Var27._M_p = *(pointer *)
                     local_278.in0.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar16].m_data;
      lVar17 = *(long *)(local_278.in0.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar16].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_560,pFVar24,(Vector<float,_4> *)&stack0xfffffffffffffa38);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_408,pFVar24,(IVal *)local_560);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_438,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar19 = (undefined8 *)local_408;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(undefined8 *)pIVar18->m_data = *puVar19;
        puVar19 = puVar19 + (ulong)bVar26 * -2 + 1;
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_438,
                 (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_438,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_438,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_3e0 = (this->m_caseCtx).precision;
      local_3e8 = pFVar24->m_maxValue;
      local_408._0_8_ = *(undefined8 *)pFVar24;
      local_408._8_4_ = pFVar24->m_fractionBits;
      local_408._12_4_ = pFVar24->m_hasSubnormal;
      local_3f8._M_allocated_capacity._0_4_ = pFVar24->m_hasInf;
      local_3f8._M_allocated_capacity._4_4_ = pFVar24->m_hasNaN;
      local_3f8._8_1_ = pFVar24->m_exactPrecision;
      local_3f8._9_3_ = *(undefined3 *)&pFVar24->field_0x19;
      local_3f8._12_4_ = *(undefined4 *)&pFVar24->field_0x1c;
      local_3d0 = 0;
      pSVar6 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3d8 = &local_438;
      (*pSVar6->_vptr_Statement[3])(pSVar6,(string *)local_408);
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_438,
                           (this->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_408,&local_498,pIVar18);
      psVar22 = (string *)local_408;
      pIVar18 = (IVal *)local_4f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar18->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar26 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      bVar11 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_4f8,
                          local_468.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 1 is outside acceptable range","");
      bVar11 = tcu::ResultCollector::check(&local_1f8,bVar11,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      pIVar18 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_438,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_408,&local_498,pIVar18);
      psVar22 = (string *)local_408;
      pIVar18 = &local_1a8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar18->m_data = (psVar22->_M_dataplus)._M_p;
        psVar22 = (string *)((long)psVar22 + (ulong)bVar26 * -0x10 + 8);
        pIVar18 = (IVal *)((long)pIVar18 + ((ulong)bVar26 * -2 + 1) * 8);
      }
      bVar12 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1a8,
                          local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 0 is outside acceptable range","");
      bVar12 = tcu::ResultCollector::check(&local_1f8,bVar12,(string *)local_408);
      if ((TestLog *)local_408._0_8_ != (TestLog *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      pFVar24 = local_568;
      if (!bVar11 || !bVar12) {
        uVar14 = (int)local_570 + 1;
        local_570 = (ulong)uVar14;
        poVar3 = (ostringstream *)(local_408 + 8);
        if ((int)uVar14 < 0x65) {
          local_408._0_8_ = local_5a0;
          std::__cxx11::ostringstream::ostringstream(poVar3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Failed",6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).in0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                   m_ptr;
          val = (Vector<float,_4> *)local_550;
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_560._0_8_ = val;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa38,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_278.in0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16),val);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,_Var27._M_p,lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p != &local_5b8) {
            operator_delete(_Var27._M_p,local_5b8._M_allocated_capacity + 1);
          }
          if ((Vector<float,_4> *)local_560._0_8_ != (Vector<float,_4> *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).out0.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                   m_ptr;
          pIVar18 = (IVal *)local_550;
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_560._0_8_ = pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa38,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_468.out0.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16),
                     (Vector<float,_4> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,_Var27._M_p,lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    (&local_598,(shaderexecutor *)&local_498,(FloatFormat *)&local_1a8,pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_598._M_dataplus._M_p,local_598._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p != &local_5b8) {
            operator_delete(_Var27._M_p,local_5b8._M_allocated_capacity + 1);
          }
          if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
          pVVar8 = (this->m_variables).out1.
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                   m_ptr;
          pIVar18 = (IVal *)local_550;
          pcVar9 = (pVVar8->m_name)._M_dataplus._M_p;
          local_560._0_8_ = pIVar18;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_560,pcVar9,pcVar9 + (pVVar8->m_name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,(char *)local_560._0_8_,local_560._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
          valueToString<tcu::Vector<float,4>>
                    ((string *)&stack0xfffffffffffffa38,(shaderexecutor *)&local_498,
                     (FloatFormat *)
                     (local_468.out1.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar16),
                     (Vector<float,_4> *)pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,_Var27._M_p,lVar17);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,"\tExpected range: ",0x11);
          intervalToString<tcu::Vector<float,4>>
                    (&local_598,(shaderexecutor *)&local_498,(FloatFormat *)local_4f8,pIVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar3,local_598._M_dataplus._M_p,local_598._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._M_dataplus._M_p != &local_598.field_2) {
            operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var27._M_p != &local_5b8) {
            operator_delete(_Var27._M_p,local_5b8._M_allocated_capacity + 1);
          }
          if ((IVal *)local_560._0_8_ != (IVal *)local_550) {
            operator_delete((void *)local_560._0_8_,local_550._0_8_ + 1);
          }
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar3);
          std::ios_base::~ios_base(local_390);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != local_470);
    iVar13 = (int)local_570;
    if (iVar13 < 0x65) {
      if (iVar13 == 0) goto LAB_008b3d6b;
    }
    else {
      poVar3 = (ostringstream *)(local_408 + 8);
      local_408._0_8_ = local_5a0;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
      std::ostream::operator<<(poVar3,iVar13 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_390);
    }
    poVar3 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_5a0;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_390);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::ostream::operator<<(local_408,iVar13);
    pTVar25 = (TestStatus *)local_550._80_8_;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    local_408._0_8_ = local_408 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)
             (CONCAT44(local_408._12_4_,local_408._8_4_) + CONCAT44(YStack_4ec,local_4f8._8_4_));
    uVar15 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._0_8_ != &local_4e8) {
      uVar15 = local_4e8._M_allocated_capacity;
    }
    if ((ulong)uVar15 < p_Var2) {
      p_Var23 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_408 + 0x10)) {
        p_Var23 = (_Base_ptr)
                  CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                           local_3f8._M_allocated_capacity._0_4_);
      }
      if (p_Var23 < p_Var2) goto LAB_008b3d59;
      puVar19 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,local_4f8._0_8_);
    }
    else {
LAB_008b3d59:
      puVar19 = (undefined8 *)std::__cxx11::string::_M_append(local_4f8,local_408._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar19 + 2);
    if ((double *)*puVar19 == pdVar1) {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar19 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar19 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar1;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar19;
    }
    local_1a8.m_data[0].m_lo = (double)puVar19[1];
    *puVar19 = pdVar1;
    puVar19[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    *&pTVar25->m_code = QP_TEST_RESULT_FAIL;
    (((string *)((long)pTVar25 + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)pTVar25 + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)pTVar25 + 8),local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) {
      operator_delete((void *)local_408._0_8_,
                      CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                               local_3f8._M_allocated_capacity._0_4_) + 1);
    }
    uVar15 = local_4e8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._0_8_ == &local_4e8) goto LAB_008b3f51;
  }
  operator_delete((void *)local_4f8._0_8_,(ulong)((long)&((_Base_ptr)uVar15)->_M_color + 1));
LAB_008b3f51:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_438);
  if (local_468.out1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar25;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}